

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadList.h
# Opt level: O2

void __thiscall QuadList<SSTableDataEntry>::clear(QuadList<SSTableDataEntry> *this)

{
  QuadListNode<SSTableDataEntry> *pQVar1;
  QuadListNode<SSTableDataEntry> *pQVar2;
  
  pQVar2 = this->header->succ;
  while (pQVar2 != this->trailer) {
    pQVar1 = pQVar2->succ;
    std::__cxx11::string::~string((string *)&(pQVar2->data).value);
    operator_delete(pQVar2,0x60);
    pQVar2 = pQVar1;
  }
  return;
}

Assistant:

void QuadList<T>::clear() {
    auto *current = header->succ;
    while (current != trailer) {
        auto *next = current->succ;
        delete current;
        current = next;
    }
}